

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::
WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
::run(WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
      *this,Module *module)

{
  int iVar1;
  PassOptions local_290;
  undefined1 local_1e8 [8];
  PassRunner runner;
  _Head_base<0UL,_wasm::Pass_*,_false> local_28;
  
  if ((this->super_Pass).runner == (PassRunner *)0x0) {
    __assert_fail("getPassRunner()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                  ,500,
                  "virtual void wasm::WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false, true, false>>>::run(Module *) [WalkerType = wasm::LinearExecutionWalker<wasm::ModAsyncify<false, true, false>>]"
                 );
  }
  iVar1 = (*(this->super_Pass)._vptr_Pass[4])();
  if ((char)iVar1 != '\0') {
    PassOptions::PassOptions(&local_290,&((this->super_Pass).runner)->options);
    local_290.optimizeLevel =
         ~-(uint)(local_290.optimizeLevel < 1) & 1 |
         local_290.optimizeLevel & -(uint)(local_290.optimizeLevel < 1);
    local_290.shrinkLevel =
         ~-(uint)(local_290.shrinkLevel < 1) & 1 |
         local_290.shrinkLevel & -(uint)(local_290.shrinkLevel < 1);
    PassOptions::PassOptions((PassOptions *)&runner.skippedPasses._M_h._M_single_bucket,&local_290);
    PassRunner::PassRunner
              ((PassRunner *)local_1e8,module,
               (PassOptions *)&runner.skippedPasses._M_h._M_single_bucket);
    PassOptions::~PassOptions((PassOptions *)&runner.skippedPasses._M_h._M_single_bucket);
    runner.options.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_1_ = 1;
    (*(this->super_Pass)._vptr_Pass[5])(&local_28,this);
    PassRunner::add((PassRunner *)local_1e8,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_28);
    if (local_28._M_head_impl != (Pass *)0x0) {
      (*(local_28._M_head_impl)->_vptr_Pass[1])();
    }
    local_28._M_head_impl = (Pass *)0x0;
    PassRunner::run((PassRunner *)local_1e8);
    PassRunner::~PassRunner((PassRunner *)local_1e8);
    PassOptions::~PassOptions(&local_290);
    return;
  }
  Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
  ::walkModule((Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                *)&this->
                   super_LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
               ,module);
  return;
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }